

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,UnaryOperator *u)

{
  Op OVar1;
  Expression *pEVar2;
  uint uVar3;
  bool bVar4;
  char local_68 [4];
  int local_64;
  Structure *local_58;
  CompileMessage local_50;
  
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(u->source).object);
  OVar1 = u->operation;
  (*(((u->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(local_68);
  if (1 < (byte)(local_68[0] - 1U)) {
    bVar4 = false;
    goto LAB_002079b3;
  }
  if (OVar1 == bitwiseNot) {
    uVar3 = local_64 - 7;
  }
  else {
    if (OVar1 == logicalNot) {
      bVar4 = local_64 == 9;
      goto LAB_002079b3;
    }
    if (OVar1 != negate) {
      throwInternalCompilerError("isTypeSuitable",0x57);
    }
    if ((local_64 - 2U < 7) && (bVar4 = true, (99U >> (local_64 - 2U & 0x1f) & 1) != 0))
    goto LAB_002079b3;
    uVar3 = local_64 - 5;
  }
  bVar4 = uVar3 < 2;
LAB_002079b3:
  RefCountedPtr<soul::Structure>::decIfNotNull(local_58);
  if (bVar4) {
    return;
  }
  pEVar2 = (u->source).object;
  CompileMessageHelpers::createMessage<>(&local_50,syntax,error,"Illegal type for unary operator");
  AST::Context::throwError(&(pEVar2->super_Statement).super_ASTObject.context,&local_50,false);
}

Assistant:

void visit (AST::UnaryOperator& u) override
        {
            super::visit (u);

            if (! UnaryOp::isTypeSuitable (u.operation, u.source->getResultType()))
                u.source->context.throwError (Errors::wrongTypeForUnary());
        }